

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf64.c
# Opt level: O0

void elf64_initoutput(GlobalVars *gv,uint32_t init_file_offset,int8_t output_endianess)

{
  undefined1 in_DL;
  undefined4 in_ESI;
  size_t in_RDI;
  size_t unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  uint32_t in_stack_ffffffffffffffec;
  undefined3 in_stack_fffffffffffffff0;
  undefined4 uVar1;
  
  uVar1 = CONCAT13(in_DL,in_stack_fffffffffffffff0);
  elf_initoutput((GlobalVars *)CONCAT44(in_ESI,uVar1),in_stack_ffffffffffffffec,
                 (int8_t)((uint)in_stack_ffffffffffffffe8 >> 0x18));
  elf_initsymtabs(CONCAT44(in_ESI,uVar1),
                  (_func_void_void_ptr_uint32_t_uint64_t_uint64_t_uint8_t_uint8_t_uint16_t_bool *)
                  CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  reloclist = elf_newreloclist(unaff_retaddr,in_RDI,
                               (_func_void_void_ptr_uint64_t_uint64_t_uint32_t_uint32_t_bool *)
                               CONCAT44(in_ESI,uVar1));
  elf64_newshdr();
  return;
}

Assistant:

static void elf64_initoutput(struct GlobalVars *gv,uint32_t init_file_offset,
                             int8_t output_endianess)
/* initialize section header, program header, relocation, symbol, */
/* string and section header string lists */
{
  elf_initoutput(gv,init_file_offset,output_endianess);
  elf_initsymtabs(sizeof(struct Elf64_Sym),elf64_initsym);

  reloclist = elf_newreloclist(sizeof(struct Elf64_Rela),
                               gv->reloctab_format!=RTAB_ADDEND ?
                               sizeof(struct Elf64_Rel) :
                               sizeof(struct Elf64_Rela),
                               elf64_initreloc);
  elf64_newshdr();          /* first Shdr is always zero */
}